

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_program.h
# Opt level: O0

void __thiscall t_program::add_include(t_program *this,string *path,string *include_site)

{
  t_program *ptVar1;
  string local_c0;
  string local_a0 [32];
  long local_80;
  size_type last_slash;
  string include_prefix;
  string local_48;
  t_program *local_28;
  t_program *program;
  string *include_site_local;
  string *path_local;
  t_program *this_local;
  
  program = (t_program *)include_site;
  include_site_local = path;
  path_local = (string *)this;
  ptVar1 = (t_program *)operator_new(0x238);
  include_prefix.field_2._M_local_buf[0xb] = '\x01';
  std::__cxx11::string::string((string *)&local_48,(string *)path);
  t_program(ptVar1,&local_48);
  include_prefix.field_2._M_local_buf[0xb] = '\0';
  std::__cxx11::string::~string((string *)&local_48);
  local_28 = ptVar1;
  std::__cxx11::string::string((string *)&last_slash);
  local_80 = 0xffffffffffffffff;
  local_80 = std::__cxx11::string::rfind((char *)include_site,0x4b4437);
  if (local_80 != -1) {
    std::__cxx11::string::substr((ulong)local_a0,(ulong)include_site);
    std::__cxx11::string::operator=((string *)&last_slash,local_a0);
    std::__cxx11::string::~string(local_a0);
  }
  ptVar1 = local_28;
  std::__cxx11::string::string((string *)&local_c0,(string *)&last_slash);
  set_include_prefix(ptVar1,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::vector<t_program_*,_std::allocator<t_program_*>_>::push_back(&this->includes_,&local_28);
  std::__cxx11::string::~string((string *)&last_slash);
  return;
}

Assistant:

void add_include(std::string path, std::string include_site) {
    t_program* program = new t_program(path);

    // include prefix for this program is the site at which it was included
    // (minus the filename)
    std::string include_prefix;
    std::string::size_type last_slash = std::string::npos;
    if ((last_slash = include_site.rfind("/")) != std::string::npos) {
      include_prefix = include_site.substr(0, last_slash);
    }

    program->set_include_prefix(include_prefix);
    includes_.push_back(program);
  }